

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

void ravi_dump_stacktop(lua_State *L,char *s)

{
  StkId pTVar1;
  
  pTVar1 = L->stack;
  printf("Stack dump %s function %d L->top = %d, ci->top = %d\n",s,
         (ulong)((long)L->ci->func - (long)pTVar1) >> 4,(ulong)((long)L->top - (long)pTVar1) >> 4,
         (ulong)((long)L->ci->top - (long)pTVar1) >> 4);
  return;
}

Assistant:

void ravi_dump_stacktop(lua_State *L, const char *s) {
  CallInfo *ci = L->ci;
  int funcpos = (int)(ci->func - L->stack);
  int top = (int)(L->top - L->stack);
  int ci_top = (int)(ci->top - L->stack);
  printf("Stack dump %s function %d L->top = %d, ci->top = %d\n", s, funcpos,
         top, ci_top);
}